

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

sequence * toml::detail::syntax::oct_int(sequence *__return_storage_ptr__,spec *param_1)

{
  pointer __p;
  repeat_at_least local_d0;
  either local_b8;
  character_in_range local_98;
  literal local_88;
  __uniq_ptr_impl<toml::detail::either,_std::default_delete<toml::detail::either>_> local_70;
  sequence local_68;
  character_in_range local_48;
  character local_38;
  character_in_range local_28;
  
  local_88.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9f8;
  local_88.value_ = "0o";
  local_88.size_ = 2;
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_98.from_ = '0';
  local_98.to_ = '7';
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_28.from_ = '0';
  local_28.to_ = '7';
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df8e0;
  local_38.value_ = '_';
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_48.from_ = '0';
  local_48.to_ = '7';
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (&local_68,&local_38,&local_48);
  either::either<toml::detail::character_in_range,toml::detail::sequence>
            (&local_b8,&local_28,&local_68);
  local_d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_004dfb58;
  local_d0.length_ = 0;
  local_d0.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x20);
  *(undefined ***)
   local_d0.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__either_004dfaa8;
  *(pointer *)
   ((long)local_d0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       local_b8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)local_d0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
       local_b8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)local_d0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
       local_b8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._M_t.
  super__Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>.
  super__Head_base<0UL,_toml::detail::either_*,_false>._M_head_impl =
       (tuple<toml::detail::either_*,_std::default_delete<toml::detail::either>_>)
       (_Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>)0x0;
  std::unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_>::~unique_ptr
            ((unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_> *)
             &local_70);
  sequence::
  sequence<toml::detail::literal,toml::detail::character_in_range,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_88,&local_98,&local_d0);
  if (local_d0.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_d0.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  local_d0.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_b8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_68.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence oct_int(const spec&)
{
    const auto digit07 = []() {
        return character_in_range(char_type('0'), char_type('7'));
    };
    return sequence(
            literal("0o"),
            digit07(),
            repeat_at_least(0,
                either(
                    digit07(),
                    sequence(character(char_type('_')), digit07())
                )
            )
        );
}